

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * mi_arena_try_alloc_at_id
                 (mi_arena_id_t arena_id,_Bool match_numa_node,int numa_node,size_t size,
                 size_t alignment,_Bool commit,_Bool allow_large,mi_arena_id_t req_arena_id,
                 mi_memid_t *memid)

{
  _Bool _Var1;
  mi_arena_id_t mVar2;
  size_t idx;
  mi_arena_t *pmVar3;
  int in_EDX;
  byte in_SIL;
  mi_arena_id_t in_EDI;
  mi_arena_id_t in_R9D;
  bool bVar4;
  size_t unaff_retaddr;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  int in_stack_00000010;
  void *p;
  _Bool numa_suitable;
  mi_arena_t *arena;
  size_t arena_index;
  size_t bcount;
  mi_arena_id_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 arena_is_exclusive;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 commit_00;
  size_t in_stack_fffffffffffffff8;
  void *pvVar5;
  
  arena_is_exclusive = (undefined1)((uint)in_stack_ffffffffffffff90 >> 0x18);
  mi_block_count_of_size(0x469335);
  idx = mi_arena_id_index(in_EDI);
  commit_00 = (undefined1)((uint)in_EDI >> 0x18);
  pmVar3 = mi_arena_from_index(idx);
  if (pmVar3 == (mi_arena_t *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else if (((in_stack_00000008 & 1) == 0) && ((pmVar3->is_large & 1U) != 0)) {
    pvVar5 = (void *)0x0;
  }
  else {
    _Var1 = mi_arena_id_is_suitable(in_R9D,(_Bool)arena_is_exclusive,in_stack_ffffffffffffff8c);
    if (_Var1) {
      mVar2 = _mi_arena_id_none();
      if (in_stack_00000010 == mVar2) {
        bVar4 = true;
        if ((-1 < in_EDX) && (bVar4 = true, -1 < pmVar3->numa_node)) {
          bVar4 = pmVar3->numa_node == in_EDX;
        }
        if ((in_SIL & 1) == 0) {
          if (bVar4) {
            return (void *)0x0;
          }
        }
        else if (!bVar4) {
          return (void *)0x0;
        }
      }
      pvVar5 = mi_arena_try_alloc_at
                         ((mi_arena_t *)CONCAT71(in_stack_00000009,in_stack_00000008),unaff_retaddr,
                          in_stack_fffffffffffffff8,(_Bool)commit_00,
                          (mi_memid_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    }
    else {
      pvVar5 = (void *)0x0;
    }
  }
  return pvVar5;
}

Assistant:

static void* mi_arena_try_alloc_at_id(mi_arena_id_t arena_id, bool match_numa_node, int numa_node, size_t size, size_t alignment,
                                       bool commit, bool allow_large, mi_arena_id_t req_arena_id, mi_memid_t* memid )
{
  MI_UNUSED_RELEASE(alignment);
  mi_assert(alignment <= MI_SEGMENT_ALIGN);
  const size_t bcount = mi_block_count_of_size(size);
  const size_t arena_index = mi_arena_id_index(arena_id);
  mi_assert_internal(arena_index < mi_atomic_load_relaxed(&mi_arena_count));
  mi_assert_internal(size <= mi_arena_block_size(bcount));

  // Check arena suitability
  mi_arena_t* arena = mi_arena_from_index(arena_index);
  if (arena == NULL) return NULL;
  if (!allow_large && arena->is_large) return NULL;
  if (!mi_arena_id_is_suitable(arena->id, arena->exclusive, req_arena_id)) return NULL;
  if (req_arena_id == _mi_arena_id_none()) { // in not specific, check numa affinity
    const bool numa_suitable = (numa_node < 0 || arena->numa_node < 0 || arena->numa_node == numa_node);
    if (match_numa_node) { if (!numa_suitable) return NULL; }
                    else { if (numa_suitable) return NULL; }
  }

  // try to allocate
  void* p = mi_arena_try_alloc_at(arena, arena_index, bcount, commit, memid);
  mi_assert_internal(p == NULL || _mi_is_aligned(p, alignment));
  return p;
}